

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void testing::internal::TuplePrefix<7ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>>,std::tuple<int,int,int,int,int,int,int>>
               (tuple<testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
                *matchers,tuple<int,_int,_int,_int,_int,_int,_int> *values,ostream *os)

{
  bool bVar1;
  __tuple_element_t<6UL,_tuple<Matcher<int>,_Matcher<int>,_Matcher<int>,_Matcher<int>,_Matcher<int>,_Matcher<int>,_Matcher<int>_>_>
  *p_Var2;
  ostream *poVar3;
  MatcherBase<int> *this;
  string local_208;
  undefined1 local_1d8 [8];
  StringMatchResultListener listener;
  Value *value;
  type matcher;
  ostream *os_local;
  tuple<int,_int,_int,_int,_int,_int,_int> *values_local;
  tuple<testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_>
  *matchers_local;
  
  matcher.super_MatcherBase<int>.buffer_ = (Buffer)os;
  TuplePrefix<6ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>>,std::tuple<int,int,int,int,int,int,int>>
            (matchers,values,os);
  p_Var2 = std::
           get<6ul,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>>
                     (matchers);
  Matcher<int>::Matcher((Matcher<int> *)&value,p_Var2);
  listener._400_8_ = std::get<6ul,int,int,int,int,int,int,int>(values);
  StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_1d8);
  bVar1 = MatcherBase<int>::MatchAndExplain
                    ((MatcherBase<int> *)&value,(int *)listener._400_8_,
                     (MatchResultListener *)local_1d8);
  if (!bVar1) {
    poVar3 = std::operator<<((ostream *)matcher.super_MatcherBase<int>.buffer_.shared,
                             "  Expected arg #");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,6);
    std::operator<<(poVar3,": ");
    this = &std::
            get<6ul,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>>
                      (matchers)->super_MatcherBase<int>;
    MatcherBase<int>::DescribeTo(this,(ostream *)matcher.super_MatcherBase<int>.buffer_.shared);
    std::operator<<((ostream *)matcher.super_MatcherBase<int>.buffer_.shared,"\n           Actual: "
                   );
    UniversalPrint<int>((int *)listener._400_8_,
                        (ostream *)matcher.super_MatcherBase<int>.buffer_.shared);
    StringMatchResultListener::str_abi_cxx11_(&local_208,(StringMatchResultListener *)local_1d8);
    PrintIfNotEmpty(&local_208,(ostream *)matcher.super_MatcherBase<int>.buffer_.shared);
    std::__cxx11::string::~string((string *)&local_208);
    std::operator<<((ostream *)matcher.super_MatcherBase<int>.buffer_.shared,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_1d8);
  Matcher<int>::~Matcher((Matcher<int> *)&value);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename std::tuple_element<N - 1, MatcherTuple>::type matcher =
        std::get<N - 1>(matchers);
    typedef typename std::tuple_element<N - 1, ValueTuple>::type Value;
    const Value& value = std::get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      *os << "  Expected arg #" << N - 1 << ": ";
      std::get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }